

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  char cVar3;
  char cVar4;
  ImGuiWindow *window;
  ImDrawList *pIVar5;
  ImGuiTableColumn *pIVar6;
  float fVar7;
  ImGuiContext *pIVar8;
  ImRect IVar9;
  ImRect IVar10;
  int column_n_00;
  ImGuiTableInstanceData *pIVar11;
  ImGuiTableCellData *pIVar12;
  long lVar13;
  int column_n;
  long lVar14;
  int iVar15;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *pIVar16;
  ImU32 col;
  int iVar17;
  ImU32 col_00;
  uint uVar18;
  float fVar19;
  float fVar20;
  ImU32 local_68;
  ImRect row_rect;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  window = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar8->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar1 = table->RowPosY2;
  (window->DC).CursorPos.y = fVar1;
  fVar2 = table->RowPosY1;
  iVar15 = table->CurrentRow;
  iVar17 = (int)table->FreezeRowsCount;
  cVar3 = table->FreezeRowsRequest;
  if (iVar15 == 0) {
    if ((long)table->InstanceCurrent == 0) {
      pIVar11 = &table->InstanceDataFirst;
    }
    else {
      pIVar11 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
    }
    pIVar11->LastFirstRowHeight = fVar1 - fVar2;
  }
  iVar15 = iVar15 + 1;
  if (((table->InnerClipRect).Min.y <= fVar1) && (fVar2 <= (table->InnerClipRect).Max.y)) {
    col = table->RowBgColor[0];
    if ((col == 0x1000000) && (col = 0, (table->Flags & 0x40) != 0)) {
      col = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
    }
    local_68 = 0;
    col_00 = table->RowBgColor[1];
    if (table->RowBgColor[1] == 0x1000000) {
      col_00 = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       ((table->Flags & 0x80) != 0)) {
      local_68 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar4 = table->RowCellDataCurrent;
    if ((-1 < cVar4 || iVar15 == iVar17) || (local_68 != 0 || (col_00 != 0 || col != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar19 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar20 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar7 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = window->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar19;
        (pIVar5->_CmdHeader).ClipRect.z = fVar20;
        (pIVar5->_CmdHeader).ClipRect.w = fVar7;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,window->DrawList,0);
    }
    if (col_00 != 0 || col != 0) {
      row_rect.Min.y = fVar2;
      row_rect.Min.x = (table->WorkRect).Min.x;
      row_rect.Max.x = (table->WorkRect).Max.x;
      row_rect.Max.y = fVar1;
      ImRect::ClipWith(&row_rect,&table->BgClipRect);
      if (col != 0) {
        if (row_rect.Min.y < row_rect.Max.y) {
          ImDrawList::AddRectFilled(window->DrawList,&row_rect.Min,&row_rect.Max,col,0.0,0);
        }
      }
      if (col_00 != 0) {
        if (row_rect.Min.y < row_rect.Max.y) {
          ImDrawList::AddRectFilled(window->DrawList,&row_rect.Min,&row_rect.Max,col_00,0.0,0);
        }
      }
    }
    if (-1 < cVar4) {
      pIVar16 = (table->RowCellData).Data;
      pIVar12 = pIVar16 + table->RowCellDataCurrent;
      for (; pIVar16 <= pIVar12; pIVar16 = pIVar16 + 1) {
        column_n_00 = (int)pIVar16->Column;
        pIVar6 = (table->Columns).Data;
        row_rect = TableGetCellBgRect(table,column_n_00);
        ImRect::ClipWith(&row_rect,&table->BgClipRect);
        IVar9 = row_rect;
        fVar19 = pIVar6[column_n_00].ClipRect.Min.x;
        fVar20 = row_rect.Max.x;
        uVar18 = -(uint)(fVar19 <= row_rect.Min.x);
        row_rect.Min.x = (float)(uVar18 & (uint)row_rect.Min.x | ~uVar18 & (uint)fVar19);
        IVar10 = row_rect;
        fVar19 = pIVar6[column_n_00].MaxX;
        if (fVar19 <= fVar20) {
          fVar20 = fVar19;
        }
        row_rect.Max.y = IVar9.Max.y;
        row_rect.Min = IVar10.Min;
        row_rect.Max.x = fVar20;
        ImDrawList::AddRectFilled
                  (window->DrawList,&row_rect.Min,&row_rect.Max,pIVar16->BgColor,0.0,0);
      }
    }
    if (((local_68 != 0) && ((table->BgClipRect).Min.y <= fVar2)) &&
       (fVar2 < (table->BgClipRect).Max.y)) {
      row_rect.Min.y = fVar2;
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar2;
      ImDrawList::AddLine(window->DrawList,&row_rect.Min,&local_38,local_68,1.0);
    }
    if (((iVar15 == iVar17) && ((table->BgClipRect).Min.y <= fVar1)) &&
       (fVar1 < (table->BgClipRect).Max.y)) {
      row_rect.Min.y = fVar1;
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar1;
      ImDrawList::AddLine(window->DrawList,&row_rect.Min,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if (iVar15 == cVar3) {
    lVar13 = 0x62;
    for (lVar14 = 0; lVar14 < table->ColumnsCount; lVar14 = lVar14 + 1) {
      *(bool *)((long)&((table->Columns).Data)->Flags + lVar13) = lVar14 < table->FreezeColumnsCount
      ;
      lVar13 = lVar13 + 0x68;
    }
  }
  if (iVar15 == iVar17) {
    table->IsUnfrozenRows = true;
    fVar1 = table->RowPosY2;
    fVar2 = (window->InnerClipRect).Min.y;
    uVar18 = -(uint)(fVar2 <= fVar1 + 1.0);
    fVar19 = (float)(~uVar18 & (uint)fVar2 | (uint)(fVar1 + 1.0) & uVar18);
    fVar2 = (window->InnerClipRect).Max.y;
    if (fVar2 <= fVar19) {
      fVar19 = fVar2;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar19;
    (table->BgClipRect).Min.y = fVar19;
    fVar2 = (window->InnerClipRect).Max.y;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar2;
    (table->BgClipRect).Max.y = fVar2;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar2 = table->RowPosY1;
    fVar19 = (fVar1 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (window->DC).CursorPos.y = fVar19;
    table->RowPosY2 = fVar19;
    table->RowPosY1 = fVar19 - (fVar1 - fVar2);
    lVar13 = 0x59;
    for (lVar14 = 0; pIVar6 = (table->Columns).Data, lVar14 < table->ColumnsCount;
        lVar14 = lVar14 + 1) {
      *(undefined1 *)((long)pIVar6 + lVar13 + -2) = *(undefined1 *)((long)&pIVar6->Flags + lVar13);
      *(float *)((long)pIVar6 + lVar13 + -0x35) = (table->Bg2ClipRectForDrawCmd).Min.y;
      lVar13 = lVar13 + 0x68;
    }
    SetWindowClipRectBeforeSetChannel(window,&pIVar6->ClipRect);
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,window->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}